

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

void plutovg_path_add_rect(plutovg_path_t *path,float x,float y,float w,float h)

{
  plutovg_path_element_t *ppVar1;
  
  plutovg_path_reserve(path,0xc);
  ppVar1 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_MOVE_TO,1);
  (ppVar1->point).x = x;
  (ppVar1->point).y = y;
  (path->start_point).x = x;
  (path->start_point).y = y;
  path->num_contours = path->num_contours + 1;
  plutovg_path_line_to(path,w + x,y);
  plutovg_path_line_to(path,w + x,h + y);
  plutovg_path_line_to(path,x,h + y);
  plutovg_path_line_to(path,x,y);
  if ((path->elements).size != 0) {
    ppVar1 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_CLOSE,1);
    *ppVar1 = *(plutovg_path_element_t *)&path->start_point;
  }
  return;
}

Assistant:

void plutovg_path_add_rect(plutovg_path_t* path, float x, float y, float w, float h)
{
    plutovg_path_reserve(path, 6 * 2);
    plutovg_path_move_to(path, x, y);
    plutovg_path_line_to(path, x + w, y);
    plutovg_path_line_to(path, x + w, y + h);
    plutovg_path_line_to(path, x, y + h);
    plutovg_path_line_to(path, x, y);
    plutovg_path_close(path);
}